

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLTest_EarlyDataVersionMismatch_Test::TestBody
          (SSLTest_EarlyDataVersionMismatch_Test *this)

{
  bool bVar1;
  int iVar2;
  SSL_METHOD *meth;
  SSL_METHOD *method;
  ulong uVar3;
  pointer *__ptr_1;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  UniquePtr<SSL> client;
  UniquePtr<SSL_SESSION> session;
  UniquePtr<SSL_CTX> server_ctx;
  UniquePtr<SSL> server;
  AssertionResult gtest_ar;
  UniquePtr<SSL_CTX> client_ctx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  _Head_base<0UL,_ssl_session_st_*,_false> local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  __uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> local_88;
  AssertHelper local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_48;
  size_type sStack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  undefined8 local_28;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_18;
  
  meth = (SSL_METHOD *)TLS_method();
  local_18._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(meth);
  local_b0._M_head_impl._0_1_ = (internal)(local_18._M_head_impl != (SSL_CTX *)0x0);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_18._M_head_impl == (SSL_CTX *)0x0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)&local_b0,(AssertionResult *)"client_ctx","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x273a,(char *)local_78);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_78 != (undefined1  [8])&local_68) {
      operator_delete((void *)local_78,(ulong)(local_68._M_allocated_capacity + 1));
    }
    if ((SSL_CTX *)local_90._M_head_impl != (SSL_CTX *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    goto LAB_001ee851;
  }
  method = TLS_method();
  CreateContextWithTestCertificate((anon_unknown_0 *)&local_90,method);
  local_b0._M_head_impl._0_1_ = (internal)((SSL_CTX *)local_90._M_head_impl != (SSL_CTX *)0x0);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((SSL_CTX *)local_90._M_head_impl == (SSL_CTX *)0x0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)&local_b0,(AssertionResult *)"server_ctx","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x273d,(char *)local_78);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if (local_78 != (undefined1  [8])&local_68) {
      operator_delete((void *)local_78,(ulong)(local_68._M_allocated_capacity + 1));
    }
    if ((SSL_SESSION *)local_98._M_head_impl != (SSL_SESSION *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
  }
  else {
    SSL_CTX_set_early_data_enabled(local_18._M_head_impl,1);
    SSL_CTX_set_early_data_enabled((SSL_CTX *)local_90._M_head_impl,1);
    SSL_CTX_set_session_cache_mode(local_18._M_head_impl,3);
    SSL_CTX_set_session_cache_mode((SSL_CTX *)local_90._M_head_impl,3);
    local_58._8_8_ = 0;
    local_38._8_8_ = 0;
    local_78 = (undefined1  [8])0x0;
    pbStack_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68._8_8_ = 0;
    local_58._M_allocated_capacity = 0;
    sStack_40 = 0;
    local_38._M_allocated_capacity = 0;
    local_28._0_4_ = 0;
    local_28._4_1_ = false;
    local_28._5_3_ = 0;
    local_68._M_allocated_capacity = (size_type)&local_58;
    local_48._M_p = (pointer)&local_38;
    CreateClientSession((anon_unknown_0 *)&local_98,local_18._M_head_impl,
                        (SSL_CTX *)local_90._M_head_impl,(ClientConfig *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p != &local_38) {
      operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_allocated_capacity != &local_58) {
      operator_delete((void *)local_68._M_allocated_capacity,local_58._M_allocated_capacity + 1);
    }
    local_b0._M_head_impl._0_1_ =
         (internal)((SSL_SESSION *)local_98._M_head_impl != (SSL_SESSION *)0x0);
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((SSL_SESSION *)local_98._M_head_impl == (SSL_SESSION *)0x0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_78,(internal *)&local_b0,(AssertionResult *)0x35c794,"false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x2745,(char *)local_78);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
      if (local_78 != (undefined1  [8])&local_68) {
        operator_delete((void *)local_78,(ulong)(local_68._M_allocated_capacity + 1));
      }
      if ((SSL *)local_a0._M_head_impl != (SSL *)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
      }
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,local_a8);
      }
    }
    else {
      iVar2 = SSL_SESSION_early_data_capable(local_98._M_head_impl);
      local_b0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_78,(internal *)&local_b0,
                   (AssertionResult *)"SSL_SESSION_early_data_capable(session.get())","false","true"
                   ,in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x2746,(char *)local_78);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
        if (local_78 != (undefined1  [8])&local_68) {
          operator_delete((void *)local_78,(ulong)(local_68._M_allocated_capacity + 1));
        }
        if ((SSL *)local_a0._M_head_impl != (SSL *)0x0) {
          (**(code **)(*(long *)local_a0._M_head_impl + 8))();
        }
      }
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,local_a8);
      }
      SSL_CTX_set_max_proto_version((SSL_CTX *)local_90._M_head_impl,0x303);
      local_a0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_88._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
           (tuple<ssl_st_*,_bssl::internal::Deleter>)
           (_Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)0x0;
      bVar1 = CreateClientAndServer
                        ((UniquePtr<SSL> *)&local_a0,(UniquePtr<SSL> *)&local_88,
                         local_18._M_head_impl,(SSL_CTX *)local_90._M_head_impl);
      local_b0._M_head_impl._0_1_ = (internal)bVar1;
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar1) {
LAB_001ede4e:
        SSL_set_session((SSL *)local_a0._M_head_impl,(SSL_SESSION *)local_98._M_head_impl);
        local_b0._M_head_impl._0_4_ = 1;
        local_b8._M_head_impl._0_4_ = SSL_do_handshake((SSL *)local_a0._M_head_impl);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_78,"1","SSL_do_handshake(client.get())",(int *)&local_b0,
                   (int *)&local_b8);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b0);
          if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_70->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x2751,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_b0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
          if (local_b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b0._M_head_impl + 8))();
          }
        }
        if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_70,pbStack_70);
        }
        iVar2 = SSL_in_early_data((SSL *)local_a0._M_head_impl);
        local_b0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
        local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_b8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_78,(internal *)&local_b0,
                     (AssertionResult *)"SSL_in_early_data(client.get())","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x2752,(char *)local_78);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if (local_78 != (undefined1  [8])&local_68) {
            operator_delete((void *)local_78,(ulong)(local_68._M_allocated_capacity + 1));
          }
          if (local_b8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b8._M_head_impl + 8))();
          }
        }
        if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a8,local_a8);
        }
        iVar2 = SSL_version((SSL *)local_a0._M_head_impl);
        local_b0._M_head_impl._0_4_ = iVar2;
        local_b8._M_head_impl._0_4_ = 0x304;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_78,"SSL_version(client.get())","0x0304",(int *)&local_b0,
                   (int *)&local_b8);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b0);
          if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_70->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x2756,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_b0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
          if (local_b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b0._M_head_impl + 8))();
          }
        }
        if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_70,pbStack_70);
        }
        local_b0._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             SSL_get0_peer_certificates(local_a0._M_head_impl);
        local_b8._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::internal::CmpHelperNE<stack_st_CRYPTO_BUFFER_const*,decltype(nullptr)>
                  ((internal *)local_78,"SSL_get0_peer_certificates(client.get())","nullptr",
                   (stack_st_CRYPTO_BUFFER **)&local_b0,&local_b8._M_head_impl);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b0);
          if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_70->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x2757,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_b0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
          if (local_b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b0._M_head_impl + 8))();
          }
        }
        if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_70,pbStack_70);
        }
        local_b0._M_head_impl._0_4_ = 0xffffffff;
        iVar2 = SSL_do_handshake((SSL *)local_88._M_t.
                                        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_b8._M_head_impl._0_4_ = iVar2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_78,"-1","SSL_do_handshake(server.get())",(int *)&local_b0,
                   (int *)&local_b8);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b0);
          if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_70->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x275b,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_b0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
          if (local_b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b0._M_head_impl + 8))();
          }
        }
        if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_70,pbStack_70);
        }
        local_b0._M_head_impl._0_4_ = 2;
        iVar2 = SSL_get_error((SSL *)local_88._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,-1);
        local_b8._M_head_impl._0_4_ = iVar2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_78,"2","SSL_get_error(server.get(), -1)",(int *)&local_b0,
                   (int *)&local_b8);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b0);
          if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_70->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x275c,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_b0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
          if (local_b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b0._M_head_impl + 8))();
          }
        }
        if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_70,pbStack_70);
        }
        local_b0._M_head_impl._0_4_ = 0xffffffff;
        iVar2 = SSL_do_handshake((SSL *)local_a0._M_head_impl);
        local_b8._M_head_impl._0_4_ = iVar2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_78,"-1","SSL_do_handshake(client.get())",(int *)&local_b0,
                   (int *)&local_b8);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b0);
          if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_70->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x2761,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_b0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
          if (local_b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b0._M_head_impl + 8))();
          }
        }
        if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_70,pbStack_70);
        }
        local_b0._M_head_impl._0_4_ = 1;
        iVar2 = SSL_get_error((SSL *)local_a0._M_head_impl,-1);
        local_b8._M_head_impl._0_4_ = iVar2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_78,"1","SSL_get_error(client.get(), -1)",(int *)&local_b0,
                   (int *)&local_b8);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b0);
          if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_70->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x2762,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_b0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
          if (local_b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b0._M_head_impl + 8))();
          }
        }
        if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_70,pbStack_70);
        }
        uVar3 = ERR_get_error();
        ErrorEquals((uint32_t)&local_b0,(int)uVar3,0x10);
        if (local_b0._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_b8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_78,(internal *)&local_b0,
                     (AssertionResult *)"ErrorEquals(ERR_get_error(), ERR_LIB_SSL, 278)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x2764,(char *)local_78);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if (local_78 != (undefined1  [8])&local_68) {
            operator_delete((void *)local_78,(ulong)(local_68._M_allocated_capacity + 1));
          }
          if (local_b8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b8._M_head_impl + 8))();
          }
        }
        if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a8,local_a8);
        }
        iVar2 = SSL_version((SSL *)local_a0._M_head_impl);
        local_b0._M_head_impl._0_4_ = iVar2;
        local_b8._M_head_impl._0_4_ = 0x304;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_78,"SSL_version(client.get())","0x0304",(int *)&local_b0,
                   (int *)&local_b8);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b0);
          if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_70->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x2770,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_b0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
          if (local_b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b0._M_head_impl + 8))();
          }
        }
        if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_70,pbStack_70);
        }
        local_b0._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             SSL_get0_peer_certificates(local_a0._M_head_impl);
        local_b8._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::internal::CmpHelperNE<stack_st_CRYPTO_BUFFER_const*,decltype(nullptr)>
                  ((internal *)local_78,"SSL_get0_peer_certificates(client.get())","nullptr",
                   (stack_st_CRYPTO_BUFFER **)&local_b0,&local_b8._M_head_impl);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b0);
          if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_70->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x2771,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_b0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
          if (local_b0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b0._M_head_impl + 8))();
          }
        }
        if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_70,pbStack_70);
        }
      }
      else {
        testing::Message::Message((Message *)&local_b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_78,(internal *)&local_b0,
                   (AssertionResult *)
                   "CreateClientAndServer(&client, &server, client_ctx.get(), server_ctx.get())",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x274c,(char *)local_78);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (local_78 != (undefined1  [8])&local_68) {
          operator_delete((void *)local_78,(ulong)(local_68._M_allocated_capacity + 1));
        }
        if (local_b8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_b8._M_head_impl + 8))();
        }
        if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a8,local_a8);
        }
        if (bVar1) goto LAB_001ede4e;
      }
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_88);
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_a0);
    }
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_98);
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_90);
LAB_001ee851:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_18);
  return;
}

Assistant:

TEST(SSLTest, EarlyDataVersionMismatch) {
  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(client_ctx);
  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  ASSERT_TRUE(server_ctx);
  SSL_CTX_set_early_data_enabled(client_ctx.get(), 1);
  SSL_CTX_set_early_data_enabled(server_ctx.get(), 1);
  SSL_CTX_set_session_cache_mode(client_ctx.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx.get(), SSL_SESS_CACHE_BOTH);

  bssl::UniquePtr<SSL_SESSION> session =
      CreateClientSession(client_ctx.get(), server_ctx.get());
  ASSERT_TRUE(session);
  EXPECT_TRUE(SSL_SESSION_early_data_capable(session.get()));

  // Turn off TLS 1.3 at the server.
  SSL_CTX_set_max_proto_version(server_ctx.get(), TLS1_2_VERSION);
  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(CreateClientAndServer(&client, &server, client_ctx.get(),
                                    server_ctx.get()));
  SSL_set_session(client.get(), session.get());

  // Send the ClientHello. The client should immediately treat the handshake as
  // successful and offer early data.
  EXPECT_EQ(1, SSL_do_handshake(client.get()));
  EXPECT_TRUE(SSL_in_early_data(client.get()));

  // In the early data state, we report the predicted version, so that callers
  // see self-consistent connection properties.
  EXPECT_EQ(SSL_version(client.get()), TLS1_3_VERSION);
  EXPECT_NE(SSL_get0_peer_certificates(client.get()), nullptr);

  // Read the ClientHello and send the ServerHello. The server will (implicitly
  // by negotiating TLS 1.2) reject early data.
  EXPECT_EQ(-1, SSL_do_handshake(server.get()));
  EXPECT_EQ(SSL_ERROR_WANT_READ, SSL_get_error(server.get(), -1));

  // Read the ServerHello. The client will now see the ServerHello and report a
  // version mismatch. Unlike other 0-RTT rejections, this is fatal, because a
  // TLS 1.2 server cannot recover from 0-RTT rejection.
  EXPECT_EQ(-1, SSL_do_handshake(client.get()));
  EXPECT_EQ(SSL_ERROR_SSL, SSL_get_error(client.get(), -1));
  EXPECT_TRUE(ErrorEquals(ERR_get_error(), ERR_LIB_SSL,
                          SSL_R_WRONG_VERSION_ON_EARLY_DATA));

  // |SSL_version| should continue reporting self-consistent state until the
  // caller calls |SSL_reset_early_data_reject|.
  //
  // TLS 1.3 to TLS 1.2 is not the most interesting version-related 0-RTT
  // rejection because it is fatal to the connection anyway. Once there are two
  // post-TLS-1.3 versions, or if we implement DTLS 1.3 0-RTT (where a DTLS 1.2
  // server will skip over early data naturally), those will make for better
  // tests. In particular, early_data accept is signaled in EncryptedExtensions,
  // but the new version is learned at ServerHello. Though an implementation
  // could already infer based on the version that early data will be rejected.
  EXPECT_EQ(SSL_version(client.get()), TLS1_3_VERSION);
  EXPECT_NE(SSL_get0_peer_certificates(client.get()), nullptr);
}